

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O3

double __thiscall
lineage::heuristics::PartitionGraph::move(PartitionGraph *this,size_t v,size_t targetPartition)

{
  vector<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  *this_00;
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  _Bit_type *p_Var4;
  pointer pRVar5;
  long lVar6;
  long lVar7;
  pointer pVVar8;
  iterator iVar9;
  bool bVar10;
  ulong uVar11;
  pointer pAVar12;
  Data *pDVar13;
  ostream *poVar14;
  runtime_error *prVar15;
  ProblemGraph *pPVar16;
  _Bit_type *p_Var17;
  _Hash_node_base *p_Var18;
  _Hash_node_base *p_Var19;
  pointer pEVar20;
  __node_base *p_Var21;
  pointer puVar22;
  ulong uVar23;
  difference_type __d;
  _Hash_node_base *p_Var24;
  ulong uVar25;
  pointer pAVar26;
  _Bit_type *p_Var27;
  size_t previousBranchingEdge;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  double local_d0;
  _Hash_node_base *local_c8;
  _Hash_node_base *local_c0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  _Bit_type *local_60;
  undefined1 local_58 [12];
  uint uStack_4c;
  _Bit_type *local_48;
  uint local_40;
  _Bit_pointer local_38;
  
  puVar3 = (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_c0 = (_Hash_node_base *)v;
  if (v < (ulong)((long)(this->vertexLabels_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
    p_Var4 = (_Bit_type *)puVar3[v];
    puVar22 = (this->partitions_).
              super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_60 = (_Bit_type *)targetPartition;
    if (2 < puVar22[(long)p_Var4]._M_h._M_element_count) {
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                (&local_b8,0);
      p_Var21 = &(this->partitions_).
                 super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)p_Var4]._M_h._M_before_begin;
      do {
        p_Var21 = p_Var21->_M_nxt;
        if (p_Var21 == (__node_base *)0x0) goto LAB_0013d969;
      } while (p_Var21[1]._M_nxt == local_c0);
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>
                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                   (unsigned_long *)(p_Var21 + 1));
      }
      else {
        *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (unsigned_long)p_Var21[1]._M_nxt
        ;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
LAB_0013d969:
      local_58._0_8_ = (_Bit_type *)0x0;
      stack0xffffffffffffffb0 = (_Bit_type *)((ulong)uStack_4c << 0x20);
      local_48 = (_Bit_type *)0x0;
      local_40 = 0;
      local_38 = (_Bit_pointer)0x0;
      pPVar16 = this->data_->problemGraph;
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)local_58,
                 (long)(pPVar16->graph_).vertices_.
                       super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pPVar16->graph_).vertices_.
                       super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,false);
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar23 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
            operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            uVar23 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          uVar25 = uVar23 + 0x3f;
          if (-1 < (long)uVar23) {
            uVar25 = uVar23;
          }
          *(ulong *)(local_58._0_8_ +
                    (((long)uVar25 >> 6) +
                    ((ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
               *(ulong *)(local_58._0_8_ +
                         (((long)uVar25 >> 6) +
                         ((ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) |
               1L << ((byte)uVar23 & 0x3f);
          pPVar16 = this->data_->problemGraph;
          pRVar5 = (pPVar16->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar26 = *(pointer *)&pRVar5[uVar23].vector_;
          if (pAVar26 != *(pointer *)((long)(pRVar5 + uVar23) + 8)) {
            do {
              p_Var19 = (_Hash_node_base *)pAVar26->vertex_;
              if (p_Var19 != local_c0) {
                p_Var18 = (_Hash_node_base *)((long)&p_Var19[7]._M_nxt + 7);
                if (-1 < (long)p_Var19) {
                  p_Var18 = p_Var19;
                }
                if (((*(ulong *)(local_58._0_8_ +
                                (((long)p_Var18 >> 6) +
                                ((ulong)(((ulong)p_Var19 & 0x800000000000003f) < 0x8000000000000001)
                                - 1)) * 8) >> ((ulong)p_Var19 & 0x3f) & 1) == 0) &&
                   ((_Bit_type *)
                    (this->vertexLabels_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)p_Var19] == p_Var4)) {
                  local_c8 = p_Var19;
                  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                  emplace_back<unsigned_long>
                            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,
                             (unsigned_long *)&local_c8);
                  pPVar16 = this->data_->problemGraph;
                }
              }
              pAVar26 = pAVar26 + 1;
            } while (pAVar26 !=
                     *(pointer *)
                      ((long)((pPVar16->graph_).vertices_.
                              super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar23) + 8));
          }
        } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      for (p_Var19 = (this->partitions_).
                     super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)p_Var4]._M_h._M_before_begin.
                     _M_nxt; p_Var19 != (_Hash_node_base *)0x0; p_Var19 = p_Var19->_M_nxt) {
        p_Var18 = p_Var19[1]._M_nxt;
        if (p_Var18 != local_c0) {
          p_Var24 = (_Hash_node_base *)((long)&p_Var18[7]._M_nxt + 7);
          if (-1 < (long)p_Var18) {
            p_Var24 = p_Var18;
          }
          if ((*(ulong *)(local_58._0_8_ +
                         (((long)p_Var24 >> 6) +
                         ((ulong)(((ulong)p_Var18 & 0x800000000000003f) < 0x8000000000000001) - 1))
                         * 8) >> ((ulong)p_Var18 & 0x3f) & 1) == 0) {
            bVar10 = false;
            goto LAB_0013db76;
          }
        }
      }
      bVar10 = true;
      if ((_Bit_type *)local_58._0_8_ == (_Bit_type *)0x0) {
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_b8);
      }
      else {
LAB_0013db76:
        operator_delete((void *)local_58._0_8_,(long)local_38 - local_58._0_8_);
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_b8);
        if (!bVar10) {
          return INFINITY;
        }
      }
      puVar22 = (this->partitions_).
                super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    p_Var27 = local_60;
    p_Var17 = (_Bit_type *)
              (((long)(this->partitions_).
                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar22 >> 3) *
              0x6db6db6db6db6db7);
    if (local_60 <= p_Var17 && (long)p_Var17 - (long)local_60 != 0) {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&puVar22[(long)p_Var4]._M_h,&local_c0);
      local_b8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           ((this->partitions_).
            super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (long)p_Var27);
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_b8._M_impl.super__Deque_impl_data._M_map,&local_c0,&local_b8);
      (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)local_c0] = (unsigned_long)p_Var27;
      local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (unsigned_long *)0x0;
      pDVar13 = this->data_;
      pPVar16 = pDVar13->problemGraph;
      pRVar5 = (pPVar16->graph_).vertices_.
               super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar26 = *(pointer *)&pRVar5[(long)local_c0].vector_;
      if (pAVar26 == *(pointer *)((long)(pRVar5 + (long)local_c0) + 8)) {
        local_d0 = 0.0;
      }
      else {
        this_00 = &(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_;
        local_d0 = 0.0;
        p_Var19 = local_c0;
        do {
          lVar6 = (long)(pPVar16->problem_->nodes).
                        super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                        super__Vector_impl_data._M_start;
          lVar7 = pAVar26->vertex_;
          uVar1 = *(uint *)(lVar6 + lVar7 * 0x18);
          uVar2 = *(uint *)(lVar6 + (long)p_Var19 * 0x18);
          if (uVar2 == uVar1) {
            p_Var17 = (_Bit_type *)
                      (this->vertexLabels_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7];
            if (p_Var17 == p_Var4) {
              local_d0 = local_d0 +
                         (pDVar13->costs).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[pAVar26->edge_];
            }
            else if (p_Var17 == p_Var27) {
              local_d0 = local_d0 -
                         (pDVar13->costs).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[pAVar26->edge_];
            }
          }
          else {
            pVVar8 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                     vertices_.
                     super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar3 = (this->vertexLabels_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar23 = puVar3[lVar7];
            if (uVar2 < uVar1) {
              pAVar12 = *(pointer *)
                         &((Adjacencies *)((long)(pVVar8 + (long)p_Var4) + 0x20))->vector_;
              uVar25 = (long)*(pointer *)((long)(pVVar8 + (long)p_Var4) + 0x28) - (long)pAVar12 >> 4
              ;
              while (uVar11 = uVar25, 0 < (long)uVar11) {
                uVar25 = uVar11 >> 1;
                if (pAVar12[uVar25].vertex_ < uVar23) {
                  pAVar12 = pAVar12 + uVar25 + 1;
                  uVar25 = ~uVar25 + uVar11;
                }
              }
              if ((*(pointer *)((long)(pVVar8 + (long)p_Var4) + 0x28) == pAVar12) ||
                 (pAVar12->vertex_ != uVar23)) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," w=",3);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::endl<char,std::char_traits<char>>(poVar14);
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar15,"Inconsistent edges!");
                __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              local_c8 = (_Hash_node_base *)pAVar12->edge_;
              p_Var17 = (_Bit_type *)puVar3[pAVar26->vertex_];
              if ((this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                  multipleEdgesEnabled_ != true) {
                pAVar12 = *(pointer *)
                           &((Adjacencies *)((long)(pVVar8 + (long)p_Var27) + 0x20))->vector_;
                uVar23 = (long)*(pointer *)((long)(pVVar8 + (long)p_Var27) + 0x28) - (long)pAVar12
                         >> 4;
                while (uVar25 = uVar23, 0 < (long)uVar25) {
                  uVar23 = uVar25 >> 1;
                  if (*(_Bit_type **)(pAVar12 + uVar23) < p_Var17) {
                    pAVar12 = pAVar12 + uVar23 + 1;
                    uVar23 = ~uVar23 + uVar25;
                  }
                }
                if ((*(pointer *)((long)(pVVar8 + (long)p_Var27) + 0x28) != pAVar12) &&
                   ((_Bit_type *)pAVar12->vertex_ == p_Var17)) {
LAB_0013de9f:
                  uVar23 = pAVar12->edge_;
                  goto LAB_0013df37;
                }
              }
              iVar9._M_current =
                   (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_58._0_8_ = p_Var27;
              unique0x100018d2 = p_Var17;
              if (iVar9._M_current ==
                  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                ::_M_realloc_insert<andres::graph::detail::Edge<true,unsigned_long>>
                          ((vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                            *)this_00,iVar9,(Edge<true,_unsigned_long> *)local_58);
                pEVar20 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                (iVar9._M_current)->vertexIndices_[0] = (Value)p_Var27;
                (iVar9._M_current)->vertexIndices_[1] = (Value)p_Var17;
                pEVar20 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1;
                (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pEVar20;
              }
              uVar23 = ((long)pEVar20 -
                        (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>)
                              .edges_.
                              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
              andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              insertAdjacenciesForEdge
                        (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                         uVar23);
            }
            else {
              pAVar12 = *(pointer *)&((Adjacencies *)((long)(pVVar8 + uVar23) + 0x20))->vector_;
              uVar25 = (long)*(pointer *)((long)(pVVar8 + uVar23) + 0x28) - (long)pAVar12 >> 4;
              while (uVar11 = uVar25, 0 < (long)uVar11) {
                uVar25 = uVar11 >> 1;
                if (*(_Bit_type **)(pAVar12 + uVar25) < p_Var4) {
                  pAVar12 = pAVar12 + uVar25 + 1;
                  uVar25 = ~uVar25 + uVar11;
                }
              }
              if ((*(pointer *)((long)(pVVar8 + uVar23) + 0x28) == pAVar12) ||
                 ((_Bit_type *)pAVar12->vertex_ != p_Var4)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error log: edge with v=",0x17);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,", w=",4);
                poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"not found!",10);
                std::endl<char,std::char_traits<char>>(poVar14);
                prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar15,"Inconsistent edges!");
                __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              local_c8 = (_Hash_node_base *)pAVar12->edge_;
              p_Var17 = (_Bit_type *)puVar3[pAVar26->vertex_];
              if ((this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                  multipleEdgesEnabled_ != true) {
                pAVar12 = *(pointer *)
                           &((Adjacencies *)((long)(pVVar8 + (long)p_Var17) + 0x20))->vector_;
                uVar23 = (long)*(pointer *)((long)(pVVar8 + (long)p_Var17) + 0x28) - (long)pAVar12
                         >> 4;
                while (uVar25 = uVar23, 0 < (long)uVar25) {
                  uVar23 = uVar25 >> 1;
                  if (*(_Bit_type **)(pAVar12 + uVar23) < p_Var27) {
                    pAVar12 = pAVar12 + uVar23 + 1;
                    uVar23 = ~uVar23 + uVar25;
                  }
                }
                if ((*(pointer *)((long)(pVVar8 + (long)p_Var17) + 0x28) != pAVar12) &&
                   ((_Bit_type *)pAVar12->vertex_ == p_Var27)) goto LAB_0013de9f;
              }
              iVar9._M_current =
                   (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_58._0_8_ = p_Var17;
              unique0x100018da = p_Var27;
              if (iVar9._M_current ==
                  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                ::_M_realloc_insert<andres::graph::detail::Edge<true,unsigned_long>>
                          ((vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                            *)this_00,iVar9,(Edge<true,_unsigned_long> *)local_58);
                pEVar20 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                (iVar9._M_current)->vertexIndices_[0] = (Value)p_Var17;
                (iVar9._M_current)->vertexIndices_[1] = (Value)p_Var27;
                pEVar20 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1;
                (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pEVar20;
              }
              uVar23 = ((long)pEVar20 -
                        (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>)
                              .edges_.
                              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
              andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
              insertAdjacenciesForEdge
                        (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                         uVar23);
            }
LAB_0013df37:
            updateEdgeCost(this,uVar23,
                           -(this->data_->costs).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start[pAVar26->edge_]);
            updateEdgeCost(this,(size_t)local_c8,
                           (this->data_->costs).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[pAVar26->edge_]);
            if ((_Elt_pointer)local_b8._M_impl.super__Deque_impl_data._M_map_size ==
                local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                         (iterator)local_b8._M_impl.super__Deque_impl_data._M_map_size,
                         (unsigned_long *)&local_c8);
            }
            else {
              *(_Hash_node_base **)local_b8._M_impl.super__Deque_impl_data._M_map_size = local_c8;
              local_b8._M_impl.super__Deque_impl_data._M_map_size =
                   local_b8._M_impl.super__Deque_impl_data._M_map_size + 8;
            }
            pDVar13 = this->data_;
            pPVar16 = pDVar13->problemGraph;
            p_Var19 = local_c0;
            p_Var27 = local_60;
          }
          pAVar26 = pAVar26 + 1;
        } while (pAVar26 !=
                 *(pointer *)
                  ((long)((pPVar16->graph_).vertices_.
                          super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)p_Var19) + 8));
      }
      removeVanishedEdges<std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
      if (local_b8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_map,
                        (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur -
                        (long)local_b8._M_impl.super__Deque_impl_data._M_map);
      }
      return local_d0;
    }
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,"Partition does not exist!");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Node: ",6);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::endl<char,std::char_traits<char>>(poVar14);
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,"Failed to move. Node doesnt exist!");
  }
  __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double move(const size_t v, const size_t targetPartition)
    {
        if (v >= vertexLabels_.size()) {
            std::cerr << "Node: " << v << std::endl;
            throw std::runtime_error("Failed to move. Node doesnt exist!");
        }
        const size_t previousPartition = vertexLabels_[v];

        // make sure moving the node doesnt split the partition.
        if (partitions_[previousPartition].size() > 2) {

            std::stack<size_t> stack;

            for (auto it = partitions_[previousPartition].cbegin();
                 it != partitions_[previousPartition].cend(); ++it) {
                if (*it != v) {
                    stack.push(*it);
                    break;
                }
            }

            std::vector<bool> visited;
            visited.resize(this->data_.problemGraph.graph().numberOfVertices(),
                           false);

            while (!stack.empty()) {
                const auto w = stack.top();
                stack.pop();

                visited[w] = true;

                for (auto it = this->data_.problemGraph.graph()
                                   .adjacenciesFromVertexBegin(w);
                     it !=
                     this->data_.problemGraph.graph().adjacenciesFromVertexEnd(
                         w);
                     ++it) {
                    if (it->vertex() == v)
                        continue;
                    if (visited[it->vertex()])
                        continue;
                    if (vertexLabels_[it->vertex()] == previousPartition)
                        stack.push(it->vertex());
                }
            }

            for (const auto& w : partitions_[previousPartition]) {
                if (w == v) {
                    continue;
                }

                // if it would break a partition, then dont move.
                if (!visited[w]) {
                    return std::numeric_limits<double>::infinity();
                }
            }
        }

        if (targetPartition >= partitions_.size())
            throw std::runtime_error("Partition does not exist!");

        // move the node v to the same partition w.
        partitions_[previousPartition].erase(v);
        partitions_[targetPartition].insert(v);
        vertexLabels_[v] = targetPartition;

        // calculate objective change in-plane and update costs for
        // the branching.
        auto objectiveChange = .0;
        std::vector<size_t> buffer;
        for (auto it =
                 this->data_.problemGraph.graph().adjacenciesFromVertexBegin(v);
             it != this->data_.problemGraph.graph().adjacenciesFromVertexEnd(v);
             ++it) {

            // in-frame.
            if (this->data_.problemGraph.frameOfNode(v) ==
                this->data_.problemGraph.frameOfNode(it->vertex())) {

                // (v, it->vertex) becomes a cut edge.
                if (vertexLabels_[it->vertex()] == previousPartition) {
                    objectiveChange += this->data_.costs[it->edge()];

                    // (v, it->vertex) becomes an internal edge.
                } else if (vertexLabels_[it->vertex()] == targetPartition) {
                    objectiveChange -= this->data_.costs[it->edge()];
                }

            } else { // inter-frame.
                size_t previousBranchingEdge, newBranchingEdge;

                if (this->data_.problemGraph.frameOfNode(v) <
                    this->data_.problemGraph.frameOfNode(it->vertex())) {

                    const auto p = this->findEdge(previousPartition,
                                                  vertexLabels_[it->vertex()]);
                    if (!p.first) {
                        std::cerr << "v=" << previousPartition
                                  << " w=" << vertexLabels_[it->vertex()]
                                  << std::endl;
                        throw std::runtime_error("Inconsistent edges!");
                    }
                    previousBranchingEdge = p.second;
                    newBranchingEdge = this->insertEdge(
                        targetPartition, vertexLabels_[it->vertex()]);
                } else {
                    const auto p = this->findEdge(vertexLabels_[it->vertex()],
                                                  previousPartition);
                    if (!p.first) {
                        std::cerr
                            << "Error log: edge with v=" << previousPartition
                            << ", w=" << vertexLabels_[it->vertex()]
                            << "not found!" << std::endl;
                        throw std::runtime_error("Inconsistent edges!");
                    }
                    previousBranchingEdge = p.second;
                    newBranchingEdge = this->insertEdge(
                        vertexLabels_[it->vertex()], targetPartition);
                }

                updateEdgeCost(newBranchingEdge,
                               -this->data_.costs[it->edge()]);
                updateEdgeCost(previousBranchingEdge,
                               this->data_.costs[it->edge()]);

                // we will only need to check branching edges where the
                // contributing edge of v was removed whether they vanished.
                buffer.emplace_back(previousBranchingEdge);
            }
        }

        // check if we have to remove edges.
        removeVanishedEdges(buffer);

        return objectiveChange;
    }